

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initExtraCompilerOutputs(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  char16_t *pcVar5;
  bool bVar6;
  ProStringList *pPVar7;
  ProString *pPVar8;
  ProStringList *pPVar9;
  QList<ProString> *pQVar10;
  ProStringList *this_00;
  ProString *pPVar11;
  qsizetype qVar12;
  ProString *this_01;
  int i;
  long lVar13;
  ulong uVar14;
  int i_1;
  long in_FS_OFFSET;
  ProString var;
  ProString *local_688;
  char16_t *pcStack_680;
  qsizetype local_678;
  ProString local_268;
  ProString local_238;
  ProString local_208;
  ProString local_1d8;
  ProString local_1a8;
  ProString local_178;
  ProString local_148;
  ProString local_118;
  ProString local_e8;
  undefined1 local_b8 [48];
  undefined1 local_88 [48];
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (ProString *)0x0;
  local_58.size = 0;
  ProString::ProString(&var,"FORMS");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&var);
  ProString::ProString((ProString *)local_88,"GENERATED_FILES");
  QList<ProString>::emplaceBack<ProString_const&>
            ((QList<ProString> *)&local_58,(ProString *)local_88);
  ProString::ProString((ProString *)local_b8,"GENERATED_SOURCES");
  QList<ProString>::emplaceBack<ProString_const&>
            ((QList<ProString> *)&local_58,(ProString *)local_b8);
  ProString::ProString(&local_e8,"HEADERS");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_e8);
  ProString::ProString(&local_118,"IDLSOURCES");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_118);
  ProString::ProString(&local_148,"LEXSOURCES");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_148);
  ProString::ProString(&local_178,"RC_FILE");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_178);
  ProString::ProString(&local_1a8,"RESOURCES");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_1a8);
  ProString::ProString(&local_1d8,"RES_FILE");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_1d8);
  ProString::ProString(&local_208,"SOURCES");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_208);
  ProString::ProString(&local_238,"TRANSLATIONS");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_238);
  ProString::ProString(&local_268,"YACCSOURCES");
  QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_268);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_268);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_238);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_208);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&var);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&var,"QMAKE_EXTRA_COMPILERS");
  pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&var);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&var);
  pPVar8 = (pPVar7->super_QList<ProString>).d.ptr;
  this_01 = pPVar8;
  do {
    qVar12 = local_678;
    pcVar5 = pcStack_680;
    pPVar11 = local_688;
    if (this_01 == pPVar8 + (pPVar7->super_QList<ProString>).d.size) {
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    local_88._8_8_ = ".input";
    local_88._0_8_ = this_01;
    ProString::ProString<ProString_const&,char_const(&)[7]>
              (&var,(QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)local_88);
    pPVar9 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&var);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&var);
    local_e8.m_string.d.size = 0;
    local_e8.m_string.d.d = (Data *)0x0;
    local_e8.m_string.d.ptr = (char16_t *)0x0;
    pPVar8 = (pPVar9->super_QList<ProString>).d.ptr;
    for (lVar13 = (pPVar9->super_QList<ProString>).d.size * 0x30; lVar13 != 0;
        lVar13 = lVar13 + -0x30) {
      var.m_file = -0x55555556;
      var._36_4_ = 0xaaaaaaaa;
      var.m_hash = 0xaaaaaaaaaaaaaaaa;
      var.m_string.d.size = -0x5555555555555556;
      var.m_offset = -0x55555556;
      var.m_length = -0x55555556;
      var.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      var.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      ProString::ProString(&var,pPVar8);
      pQVar10 = &QMakeEvaluator::valuesRef
                           (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project)
                             ->super_QMakeEvaluator,(ProKey *)&var)->super_QList<ProString>;
      QList<ProString>::append((QList<ProString> *)&local_e8,pQVar10);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&var);
      pPVar8 = pPVar8 + 1;
    }
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    local_88._8_8_ = ".output";
    local_88._0_8_ = this_01;
    ProString::ProString<ProString_const&,char_const(&)[8]>
              (&var,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)local_88);
    this_00 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&var);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&var);
    memset((VCFilter *)&var,0xaa,0x448);
    VCFilter::VCFilter((VCFilter *)&var);
    ProString::toQString(&local_118.m_string,this_01);
    ProString::ProString((ProString *)local_88,&local_118.m_string);
    ProStringList::toQStringList((QStringList *)&local_148,(ProStringList *)&local_e8);
    ProStringList::toQStringList((QStringList *)&local_178,this_00);
    extraCompilerName((QString *)local_b8,this,(ProString *)local_88,(QStringList *)&local_148,
                      (QStringList *)&local_178);
    qVar4 = var.m_string.d.size;
    pcVar3 = var.m_string.d.ptr;
    pDVar2 = var.m_string.d.d;
    var.m_string.d.d = (Data *)local_b8._0_8_;
    var.m_string.d.ptr = (char16_t *)local_b8._8_8_;
    local_b8._0_8_ = pDVar2;
    local_b8._8_8_ = pcVar3;
    var.m_string.d.size = local_b8._16_8_;
    local_b8._16_8_ = qVar4;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_178);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_148);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
    QString::operator=((QString *)&var.m_offset,"");
    QString::QString(&local_148.m_string,"{E0D8C965-CC5F-43d7-AD63-FAEF0BBC0F85}");
    local_b8._16_8_ = local_148.m_string.d.size;
    local_b8._8_8_ = local_148.m_string.d.ptr;
    local_b8._0_8_ = local_148.m_string.d.d;
    local_148.m_string.d.d = (Data *)0x0;
    local_148.m_string.d.ptr = (char16_t *)0x0;
    local_148.m_string.d.size = 0;
    local_b8._24_8_ = "-";
    QStringBuilder<QString,_const_char_(&)[2]>::QStringBuilder
              ((QStringBuilder<QString,_const_char_(&)[2]> *)local_88,
               (QStringBuilder<QString,_const_char_(&)[2]> *)local_b8);
    local_88._32_8_ = this_01;
    QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&>::
    convertTo<QString>(&local_118.m_string,
                       (QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_ProString_&>
                        *)local_88);
    local_688 = (ProString *)local_118.m_string.d.d;
    pcStack_680 = local_118.m_string.d.ptr;
    local_118.m_string.d.d = (Data *)pPVar11;
    local_118.m_string.d.ptr = pcVar5;
    local_678 = local_118.m_string.d.size;
    local_118.m_string.d.size = qVar12;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148);
    firstExpandedOutputFileName((QString *)local_88,this,this_01);
    bVar6 = hasBuiltinCompiler((QString *)local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    if (bVar6) {
      pPVar8 = (pPVar9->super_QList<ProString>).d.ptr;
      pPVar11 = pPVar8 + (pPVar9->super_QList<ProString>).d.size;
      for (; pPVar8 != pPVar11; pPVar8 = pPVar8 + 1) {
        bVar6 = ProStringList::contains((ProStringList *)&local_58,pPVar8,CaseSensitive);
        if (!bVar6) {
          pPVar9 = QMakeEvaluator::valuesRef
                             (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.project
                               )->super_QMakeEvaluator,(ProKey *)pPVar8);
          lVar13 = 0;
          for (uVar14 = 0; uVar14 < (ulong)(pPVar9->super_QList<ProString>).d.size;
              uVar14 = uVar14 + 1) {
            ProString::toQString
                      ((QString *)local_88,
                       (ProString *)
                       ((long)&(((pPVar9->super_QList<ProString>).d.ptr)->m_string).d.d + lVar13));
            bVar6 = QHash<QString,_QList<QString>_>::contains
                              (&this->extraCompilerSources,(QString *)local_88);
            if (bVar6) {
              bVar6 = otherFiltersContain(this,(QString *)local_88);
              if (!bVar6) {
                local_148.m_string.d.d = (Data *)0x0;
                local_148.m_string.d.ptr = (char16_t *)0x0;
                local_148.m_string.d.size = 0;
                local_178.m_string.d.d = (Data *)0x0;
                local_178.m_string.d.ptr = (char16_t *)0x0;
                local_178.m_string.d.size = 0;
                MakefileGenerator::replaceExtraCompilerVariables
                          (&local_118.m_string,(MakefileGenerator *)this,(QString *)local_88,
                           &local_148.m_string,&local_178.m_string,NoShell);
                Option::fixPathToTargetOS((QString *)local_b8,&local_118.m_string,false,true);
                VCFilter::addFile((VCFilter *)&var,(QString *)local_b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_b8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_118);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_178);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_148);
              }
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            lVar13 = lVar13 + 0x30;
          }
        }
      }
LAB_001cd57c:
      QList<VCFilter>::emplaceBack<VCFilter_const&>
                (&(this->vcProject).ExtraCompilersFiles,(VCFilter *)&var);
    }
    else {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      local_118.m_string.d.ptr = L".variable_out";
      local_118.m_string.d.d = (Data *)this_01;
      ProString::ProString<ProString_const&,char_const(&)[14]>
                ((ProString *)local_b8,
                 (QStringBuilder<const_ProString_&,_const_char_(&)[14]> *)&local_118);
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      if (local_88._28_4_ == 0) {
LAB_001cd3c3:
        local_118.m_string.d.size = 0;
        local_118.m_string.d.d = (Data *)0x0;
        local_118.m_string.d.ptr = (char16_t *)0x0;
        if ((this_00->super_QList<ProString>).d.size != 0) {
          ProString::toQString((QString *)local_b8,(this_00->super_QList<ProString>).d.ptr);
          qVar12 = local_118.m_string.d.size;
          pcVar5 = local_118.m_string.d.ptr;
          pDVar2 = local_118.m_string.d.d;
          local_118.m_string.d.d = (Data *)local_b8._0_8_;
          local_118.m_string.d.ptr = (char16_t *)local_b8._8_8_;
          local_b8._0_8_ = pDVar2;
          local_b8._8_8_ = pcVar5;
          local_118.m_string.d.size = local_b8._16_8_;
          local_b8._16_8_ = qVar12;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
        }
        pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        local_148.m_string.d.ptr = L".CONFIG";
        local_148.m_string.d.d = (Data *)this_01;
        ProString::ProString<ProString_const&,char_const(&)[8]>
                  ((ProString *)local_b8,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_148);
        pQVar10 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8)->
                   super_QList<ProString>;
        qVar12 = QtPrivate::indexOf<ProString,char[8]>(pQVar10,(char (*) [8])"combine",0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
        if (qVar12 == -1) {
          if ((pPVar9->super_QList<ProString>).d.size != 0) {
            pPVar9 = QMakeEvaluator::valuesRef
                               (&((this->super_Win32MakefileGenerator).super_MakefileGenerator.
                                 project)->super_QMakeEvaluator,
                                (ProKey *)(pPVar9->super_QList<ProString>).d.ptr);
            lVar13 = 0;
            for (uVar14 = 0; uVar14 < (ulong)(pPVar9->super_QList<ProString>).d.size;
                uVar14 = uVar14 + 1) {
              ProString::toQString
                        ((QString *)local_b8,
                         (ProString *)
                         ((long)&(((pPVar9->super_QList<ProString>).d.ptr)->m_string).d.d + lVar13))
              ;
              bVar6 = QHash<QString,_QList<QString>_>::contains
                                (&this->extraCompilerSources,(QString *)local_b8);
              if (bVar6) {
                bVar6 = otherFiltersContain(this,(QString *)local_b8);
                if (!bVar6) {
                  local_1a8.m_string.d.d = (Data *)0x0;
                  local_1a8.m_string.d.ptr = (char16_t *)0x0;
                  local_1a8.m_string.d.size = 0;
                  MakefileGenerator::replaceExtraCompilerVariables
                            (&local_178.m_string,(MakefileGenerator *)this,(QString *)local_b8,
                             &local_118.m_string,&local_1a8.m_string,NoShell);
                  Option::fixPathToTargetOS(&local_148.m_string,&local_178.m_string,false,true);
                  VCFilter::addFile((VCFilter *)&var,&local_148.m_string);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_148);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_178);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_1a8);
                }
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_b8);
              lVar13 = lVar13 + 0x30;
            }
          }
        }
        else {
          local_208.m_string.d.d = (Data *)&local_118;
          local_208.m_string.d.ptr = (char16_t *)&this->customBuildToolFilterFileSuffix;
          QStringBuilder<QString_&,_const_QString_&>::convertTo<QString>
                    (&local_178.m_string,(QStringBuilder<QString_&,_const_QString_&> *)&local_208);
          local_1a8.m_string.d.d = (Data *)0x0;
          local_1a8.m_string.d.ptr = (char16_t *)0x0;
          local_1a8.m_string.d.size = 0;
          local_1d8.m_string.d.d = (Data *)0x0;
          local_1d8.m_string.d.ptr = (char16_t *)0x0;
          local_1d8.m_string.d.size = 0;
          MakefileGenerator::replaceExtraCompilerVariables
                    (&local_148.m_string,(MakefileGenerator *)this,&local_178.m_string,
                     &local_1a8.m_string,&local_1d8.m_string,NoShell);
          Option::fixPathToTargetOS((QString *)local_b8,&local_148.m_string,false,true);
          VCFilter::addFile((VCFilter *)&var,(QString *)local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_148)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_178)
          ;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        goto LAB_001cd57c;
      }
      bVar6 = ProStringList::contains
                        ((ProStringList *)&local_58,(ProString *)local_88,CaseSensitive);
      if (!bVar6) goto LAB_001cd3c3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    }
    VCFilter::~VCFilter((VCFilter *)&var);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_e8);
    this_01 = this_01 + 1;
    pPVar8 = (pPVar7->super_QList<ProString>).d.ptr;
  } while( true );
}

Assistant:

void VcprojGenerator::initExtraCompilerOutputs()
{
    ProStringList otherFilters;
    otherFilters << "FORMS"
                 << "GENERATED_FILES"
                 << "GENERATED_SOURCES"
                 << "HEADERS"
                 << "IDLSOURCES"
                 << "LEXSOURCES"
                 << "RC_FILE"
                 << "RESOURCES"
                 << "RES_FILE"
                 << "SOURCES"
                 << "TRANSLATIONS"
                 << "YACCSOURCES";
    const ProStringList &quc = project->values("QMAKE_EXTRA_COMPILERS");
    for (ProStringList::ConstIterator it = quc.begin(); it != quc.end(); ++it) {
        const ProStringList &inputVars = project->values(ProKey(*it + ".input"));
        ProStringList inputFiles;
        for (auto var : inputVars)
            inputFiles.append(project->values(var.toKey()));
        const ProStringList &outputs = project->values(ProKey(*it + ".output"));

        // Create an extra compiler filter and add the files
        VCFilter extraCompile;
        extraCompile.Name = extraCompilerName(it->toQString(), inputFiles.toQStringList(),
                                              outputs.toQStringList());
        extraCompile.ParseFiles = _False;
        extraCompile.Filter = "";
        extraCompile.Guid = QString(_GUIDExtraCompilerFiles) + "-" + (*it);

        bool addOnInput = hasBuiltinCompiler(firstExpandedOutputFileName(*it));
        if (!addOnInput) {
            // If the extra compiler has a variable_out set that is already handled
            // some other place, ignore it.
            const ProString &outputVar = project->first(ProKey(*it + ".variable_out"));
            if (!outputVar.isEmpty() && otherFilters.contains(outputVar))
                continue;

            QString tmp_out;
            if (!outputs.isEmpty())
                tmp_out = outputs.first().toQString();
            if (project->values(ProKey(*it + ".CONFIG")).indexOf("combine") != -1) {
                // Combined output, only one file result. Use .cbt file.
                extraCompile.addFile(Option::fixPathToTargetOS(
                        replaceExtraCompilerVariables(tmp_out + customBuildToolFilterFileSuffix,
                                                      QString(), QString(), NoShell), false));
            } else if (!inputVars.isEmpty()) {
                // One output file per input
                const ProStringList &tmp_in = project->values(inputVars.first().toKey());
                for (int i = 0; i < tmp_in.size(); ++i) {
                    const QString &filename = tmp_in.at(i).toQString();
                    if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                        extraCompile.addFile(Option::fixPathToTargetOS(
                                replaceExtraCompilerVariables(filename, tmp_out, QString(), NoShell), false));
                }
            }
        } else {
            // In this case we the outputs have a built-in compiler, so we cannot add the custom
            // build steps there. So, we turn it around and add it to the input files instead,
            // provided that the input file variable is not handled already (those in otherFilters
            // are handled, so we avoid them).
            for (const ProString &inputVar : inputVars) {
                if (!otherFilters.contains(inputVar)) {
                    const ProStringList &tmp_in = project->values(inputVar.toKey());
                    for (int i = 0; i < tmp_in.size(); ++i) {
                        const QString &filename = tmp_in.at(i).toQString();
                        if (extraCompilerSources.contains(filename) && !otherFiltersContain(filename))
                            extraCompile.addFile(Option::fixPathToTargetOS(
                                    replaceExtraCompilerVariables(filename, QString(), QString(), NoShell), false));
                    }
                }
            }
        }
        extraCompile.Project = this;
        extraCompile.Config = &(vcProject.Configuration);

        vcProject.ExtraCompilersFiles.append(extraCompile);
    }
}